

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_remove_common(AV1_COMMON *cm)

{
  _func_void_CommonModeInfoParams_ptr *p_Var1;
  
  p_Var1 = (cm->mi_params).free_mi;
  if (p_Var1 != (_func_void_CommonModeInfoParams_ptr *)0x0) {
    (*p_Var1)(&cm->mi_params);
  }
  av1_free_above_context_buffers(&cm->above_contexts);
  aom_free(cm->fc);
  cm->fc = (FRAME_CONTEXT *)0x0;
  aom_free(cm->default_frame_context);
  cm->default_frame_context = (FRAME_CONTEXT *)0x0;
  return;
}

Assistant:

void av1_remove_common(AV1_COMMON *cm) {
  av1_free_context_buffers(cm);

  aom_free(cm->fc);
  cm->fc = NULL;
  aom_free(cm->default_frame_context);
  cm->default_frame_context = NULL;
}